

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendOpCodeAttr.cpp
# Opt level: O2

int OpCodeAttr::GetOpCodeAttributes(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 *puVar4;
  int *piVar5;
  undefined1 *puVar6;
  
  if (op < InvalidOpCode) {
    uVar3 = (ulong)op;
    puVar6 = OpcodeAttributes;
  }
  else {
    if (Decr_Num_A < op) {
      if (0x328 < op - 0x18a) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                           ,0x5b,
                           "(opIndex < (sizeof(*__countof_helper(BackendOpCodeAttributes)) + 0))",
                           "opIndex < (sizeof(*__countof_helper(BackendOpCodeAttributes)) + 0)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      piVar5 = (int *)(BackendOpCodeAttributes + (ulong)(op - 0x18a) * 4);
      goto LAB_00747125;
    }
    uVar3 = (ulong)(op - 0x100);
    puVar6 = ExtendedOpcodeAttributes;
  }
  piVar5 = (int *)(puVar6 + uVar3 * 4);
LAB_00747125:
  return *piVar5;
}

Assistant:

static const int GetOpCodeAttributes(Js::OpCode op)
{
    if (op <= Js::OpCode::MaxByteSizedOpcodes)
    {
        AnalysisAssert(op < _countof(OpcodeAttributes));
        return OpcodeAttributes[(int)op];
    }
    else if (op < Js::OpCode::ByteCodeLast)
    {
        uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
        AnalysisAssert(opIndex < _countof(ExtendedOpcodeAttributes));
        return ExtendedOpcodeAttributes[opIndex];
    }
    uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
    AnalysisAssert(opIndex < _countof(BackendOpCodeAttributes));
    return BackendOpCodeAttributes[opIndex];
}